

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  String local_40;
  string local_30;
  
  String::Format((char *)&local_40,"event=TestCaseStart&name=%s\n",(test_case->name_).c_str_);
  String::operator_cast_to_string(&local_30,&local_40);
  Send(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  String::~String(&local_40);
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) {
    Send(String::Format("event=TestCaseStart&name=%s\n", test_case.name()));
  }